

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.h
# Opt level: O0

byte_vec_t * sfc::pack_native_mapentry(byte_vec_t *__return_storage_ptr__,Mapentry *entry,Mode mode)

{
  int iVar1;
  int iVar2;
  byte local_40;
  value_type_conflict1 local_3f;
  byte local_3e;
  value_type_conflict1 local_3d;
  byte local_3c;
  value_type_conflict1 local_3b;
  byte local_3a;
  value_type_conflict1 local_39;
  byte local_38;
  value_type_conflict1 local_37;
  value_type_conflict1 local_36;
  byte local_35;
  value_type_conflict1 local_34;
  byte local_33;
  value_type_conflict1 local_32;
  value_type_conflict1 local_31;
  value_type_conflict1 local_30;
  value_type_conflict1 local_2f;
  value_type_conflict1 local_2e;
  byte local_2d [15];
  value_type_conflict1 local_1e [2];
  Mode local_1c;
  Mapentry *pMStack_18;
  Mode mode_local;
  Mapentry *entry_local;
  byte_vec_t *v;
  
  local_1e[1] = 0;
  local_1c = mode;
  pMStack_18 = entry;
  entry_local = (Mapentry *)__return_storage_ptr__;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__);
  switch(local_1c) {
  case none:
  case pce_sprite:
    break;
  case snes:
    local_1e[0] = (value_type_conflict1)pMStack_18->tile_index;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (__return_storage_ptr__,local_1e);
    local_2d[0] = ((byte)(pMStack_18->tile_index >> 8) & 3) +
                  ((byte)pMStack_18->palette_index & 7) * '\x04' | (pMStack_18->flip_h & 1U) << 6 |
                  pMStack_18->flip_v << 7;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (__return_storage_ptr__,local_2d);
    break;
  case snes_mode7:
    local_2e = (value_type_conflict1)pMStack_18->tile_index;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (__return_storage_ptr__,&local_2e);
    break;
  case gb:
    local_2f = (value_type_conflict1)pMStack_18->tile_index;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (__return_storage_ptr__,&local_2f);
    break;
  case gbc:
    local_32 = (value_type_conflict1)pMStack_18->tile_index;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (__return_storage_ptr__,&local_32);
    local_33 = (byte)pMStack_18->palette_index & 7 | (byte)(pMStack_18->tile_index >> 5) & 8 |
               (pMStack_18->flip_h & 1U) << 5 | (pMStack_18->flip_v & 1U) << 6;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (__return_storage_ptr__,&local_33);
    break;
  case gba:
    local_34 = (value_type_conflict1)pMStack_18->tile_index;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (__return_storage_ptr__,&local_34);
    local_35 = ((byte)(pMStack_18->tile_index >> 8) & 3) + (pMStack_18->flip_h & 1U) * '\x04' +
               (pMStack_18->flip_v & 1U) * '\b' | (byte)(pMStack_18->palette_index << 4);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (__return_storage_ptr__,&local_35);
    break;
  case gba_affine:
    local_36 = (value_type_conflict1)pMStack_18->tile_index;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (__return_storage_ptr__,&local_36);
    break;
  case md:
    local_37 = (value_type_conflict1)pMStack_18->tile_index;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (__return_storage_ptr__,&local_37);
    local_38 = ((byte)(pMStack_18->tile_index >> 8) & 7) + (pMStack_18->flip_h & 1U) * '\b' |
               (pMStack_18->flip_v & 1U) << 4 | (byte)((pMStack_18->palette_index & 3) << 5);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (__return_storage_ptr__,&local_38);
    break;
  case pce:
    local_39 = (value_type_conflict1)pMStack_18->tile_index;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (__return_storage_ptr__,&local_39);
    local_3a = (byte)(pMStack_18->tile_index >> 8) & 0xf | (byte)(pMStack_18->palette_index << 4);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (__return_storage_ptr__,&local_3a);
    break;
  case ws:
  case wsc:
  case wsc_packed:
    local_3b = (value_type_conflict1)pMStack_18->tile_index;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (__return_storage_ptr__,&local_3b);
    local_3c = ((byte)(pMStack_18->tile_index >> 8) & 1) +
               ((byte)pMStack_18->palette_index & 0xf) * '\x02' |
               (byte)(pMStack_18->tile_index >> 4) & 0x20 | (pMStack_18->flip_h & 1U) << 6 |
               pMStack_18->flip_v << 7;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (__return_storage_ptr__,&local_3c);
    break;
  case ngp:
    local_3d = (value_type_conflict1)pMStack_18->tile_index;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (__return_storage_ptr__,&local_3d);
    iVar1._0_1_ = pMStack_18->flip_h;
    iVar1._1_1_ = pMStack_18->flip_v;
    iVar1._2_2_ = *(undefined2 *)&pMStack_18->field_0xa;
    local_3e = (byte)(pMStack_18->tile_index >> 8) & 1 |
               (byte)((pMStack_18->palette_index & 1) << 5) | (pMStack_18->flip_v & 1U) << 6 |
               (byte)(iVar1 << 7);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (__return_storage_ptr__,&local_3e);
    break;
  case ngpc:
    local_3f = (value_type_conflict1)pMStack_18->tile_index;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (__return_storage_ptr__,&local_3f);
    iVar2._0_1_ = pMStack_18->flip_h;
    iVar2._1_1_ = pMStack_18->flip_v;
    iVar2._2_2_ = *(undefined2 *)&pMStack_18->field_0xa;
    local_40 = ((byte)(pMStack_18->tile_index >> 8) & 1) +
               ((byte)pMStack_18->palette_index & 0xf) * '\x02' | (pMStack_18->flip_v & 1U) << 6 |
               (byte)(iVar2 << 7);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (__return_storage_ptr__,&local_40);
    break;
  case sms:
  case gg:
    local_30 = (value_type_conflict1)pMStack_18->tile_index;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (__return_storage_ptr__,&local_30);
    local_31 = ((byte)(pMStack_18->tile_index >> 8) & 1) + (pMStack_18->flip_h & 1U) * '\x02' +
               (pMStack_18->flip_v & 1U) * '\x04' + ((byte)pMStack_18->palette_index & 1) * '\b';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (__return_storage_ptr__,&local_31);
  }
  return __return_storage_ptr__;
}

Assistant:

inline byte_vec_t pack_native_mapentry(const Mapentry& entry, Mode mode) {
  byte_vec_t v;
  switch (mode) {
  case Mode::snes:
    v.push_back(entry.tile_index & 0xff);
    v.push_back(((entry.tile_index >> 8) & 0x03) | ((entry.palette_index << 2) & 0x1c) | (entry.flip_h << 6) | (entry.flip_v << 7));
    break;

  case Mode::snes_mode7:
    v.push_back(entry.tile_index & 0xff);
    break;

  case Mode::gb:
    v.push_back(entry.tile_index & 0xff);
    break;

  case Mode::sms:
  case Mode::gg:
    v.push_back(entry.tile_index & 0xff);
    v.push_back(((entry.tile_index >> 8) & 0x01) | (entry.flip_h << 1) | (entry.flip_v << 2) | ((entry.palette_index << 3) & 0x8));
    // SMS and GG support depth information per tile in tilemap, instead of per sprite. But superfamiconv doesn't provide that rope?
    break;

  case Mode::gbc:
    v.push_back(entry.tile_index & 0xff);
    v.push_back(((entry.palette_index) & 0x07) | ((entry.tile_index >> 5) & 0x08) | (entry.flip_h << 5) | (entry.flip_v << 6));
    break;

  case Mode::gba:
    v.push_back(entry.tile_index & 0xff);
    v.push_back(((entry.tile_index >> 8) & 0x03) | (entry.flip_h << 2) | (entry.flip_v << 3) | ((entry.palette_index << 4) & 0xf0));
    break;

  case Mode::gba_affine:
    v.push_back(entry.tile_index & 0xff);
    break;

  case Mode::md:
    v.push_back(entry.tile_index & 0xff);
    v.push_back(((entry.tile_index >> 8) & 0x07) | (entry.flip_h << 3) | (entry.flip_v << 4) | ((entry.palette_index << 5) & 0x60));
    break;

  case Mode::pce:
    v.push_back(entry.tile_index & 0xff);
    v.push_back(((entry.tile_index >> 8) & 0x0f) | ((entry.palette_index << 4) & 0xf0));
    break;

  case Mode::ws:
  case Mode::wsc:
  case Mode::wsc_packed:
    v.push_back(entry.tile_index & 0xff);
    v.push_back(((entry.tile_index >> 8) & 0x01) | ((entry.palette_index << 1) & 0x1e) | ((entry.tile_index >> 4) & 0x20) | (entry.flip_h << 6) | (entry.flip_v << 7));
    break;

  case Mode::ngp:
    v.push_back(entry.tile_index & 0xff);
    v.push_back(((entry.tile_index >> 8) & 0x01) | ((entry.palette_index << 5) & 0x20) | (entry.flip_v << 6) | (entry.flip_h << 7));
    break;

  case Mode::ngpc:
    v.push_back(entry.tile_index & 0xff);
    v.push_back(((entry.tile_index >> 8) & 0x01) | ((entry.palette_index << 1) & 0x1e) | (entry.flip_v << 6) | (entry.flip_h << 7));
    break;

  case Mode::pce_sprite:
  case Mode::none:
    break;
  }
  return v;
}